

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWRaster.cpp
# Opt level: O1

Cell * __thiscall TRM::SWRaster::find_cell(SWRaster *this)

{
  pointer *ppCVar1;
  int32_t *__k;
  pointer pCVar2;
  iterator __position;
  bool bVar3;
  pointer pCVar4;
  value_type *__val;
  size_type sVar5;
  mapped_type *pmVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  pointer this_00;
  bool bVar10;
  vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_> list;
  vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_> local_38;
  
  this_00 = (pointer)&this->m_cells_y;
  __k = &this->m_ey;
  sVar5 = std::
          _Hashtable<int,_std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>,_std::allocator<std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::count((_Hashtable<int,_std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>,_std::allocator<std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)this_00,__k);
  if (sVar5 == 0) {
    local_38.super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38.super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_38.super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(0xc);
    local_38.super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_38.super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>.
         _M_impl.super__Vector_impl_data._M_start + 1;
    (local_38.super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>._M_impl.
     super__Vector_impl_data._M_start)->x = 0;
    (local_38.super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>._M_impl.
     super__Vector_impl_data._M_start)->cover = 0;
    (local_38.super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>._M_impl.
     super__Vector_impl_data._M_start)->area = 0;
    local_38.super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_38.super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    pmVar6 = std::__detail::
             _Map_base<int,_std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>,_std::allocator<std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>,_std::allocator<std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,__k);
    std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>::operator=
              (pmVar6,&local_38);
    pmVar6 = std::__detail::
             _Map_base<int,_std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>,_std::allocator<std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>,_std::allocator<std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,__k);
    this_00 = (pmVar6->super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>
              )._M_impl.super__Vector_impl_data._M_start;
    this_00->x = this->m_ex;
    this_00->cover = 0;
    this_00->area = 0;
    if (local_38.super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.
                      super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_38.
                            super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.
                            super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    pmVar6 = std::__detail::
             _Map_base<int,_std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>,_std::allocator<std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>,_std::allocator<std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,__k);
    pCVar2 = (pmVar6->super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    __position._M_current =
         (pmVar6->super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    iVar7 = -1;
    bVar3 = true;
    if ((long)__position._M_current - (long)pCVar2 != 0) {
      lVar8 = ((long)__position._M_current - (long)pCVar2 >> 2) * -0x5555555555555555;
      lVar9 = 0;
      pCVar4 = pCVar2;
      do {
        this_00 = pCVar4;
        bVar10 = this_00->x == this->m_ex;
        bVar3 = !bVar10;
        if (bVar10) break;
        if (!bVar10 && this->m_ex <= this_00->x) {
          iVar7 = (int)lVar9;
          bVar3 = true;
          break;
        }
        lVar9 = lVar9 + 1;
        pCVar4 = this_00 + 1;
      } while (lVar8 + (ulong)(lVar8 == 0) != lVar9);
    }
    if (bVar3) {
      if (iVar7 == -1) {
        local_38.super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_38.super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             (pointer)((ulong)local_38.
                              super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>
                              ._M_impl.super__Vector_impl_data._M_finish._4_4_ << 0x20);
        if (__position._M_current ==
            (pmVar6->super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>::
          _M_realloc_insert<TRM::SWRaster::Cell>(pmVar6,__position,(Cell *)&local_38);
        }
        else {
          (__position._M_current)->area = 0;
          (__position._M_current)->x = 0;
          (__position._M_current)->cover = 0;
          ppCVar1 = &(pmVar6->
                     super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppCVar1 = *ppCVar1 + 1;
        }
        this_00 = (pmVar6->
                  super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>).
                  _M_impl.super__Vector_impl_data._M_finish + -1;
      }
      else {
        local_38.super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_38.super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             (pointer)((ulong)local_38.
                              super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>
                              ._M_impl.super__Vector_impl_data._M_finish._4_4_ << 0x20);
        std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>::_M_insert_rval
                  (pmVar6,pCVar2 + iVar7,(value_type *)&local_38);
        this_00 = (pmVar6->
                  super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>).
                  _M_impl.super__Vector_impl_data._M_start + iVar7;
      }
      this_00->x = this->m_ex;
      this_00->cover = 0;
      this_00->area = 0;
    }
  }
  return this_00;
}

Assistant:

SWRaster::Cell* SWRaster::find_cell() {
  if (m_cells_y.count(m_ey) == 0) {
    std::vector<Cell> list(1);
    m_cells_y[m_ey] = list;

    auto cell = &m_cells_y[m_ey][0];
    cell->x = m_ex;
    cell->area = 0;
    cell->cover = 0;
    return cell;
  }

  auto& list = m_cells_y[m_ey];

  int32_t index = -1;
  for (size_t i = 0; i < list.size(); i++) {
    if (list[i].x == m_ex) {
      return &list[i];
    }

    if (list[i].x > m_ex) {
      index = i;
      break;
    }
  }

  Cell* cell = nullptr;
  if (index != -1) {
    list.insert(list.begin() + index, Cell{});
    cell = &list[index];
  } else {
    list.emplace_back(Cell{});
    cell = &list.back();
  }

  cell->x = m_ex;
  cell->area = 0;
  cell->cover = 0;

  return cell;
}